

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_order_t *
bov_order_partial_update(bov_order_t *order,GLuint *elements,GLint start,GLsizei count,GLsizei newN)

{
  int local_2c;
  GLsizei newN_local;
  GLsizei count_local;
  GLint start_local;
  GLuint *elements_local;
  bov_order_t *order_local;
  
  if (elements == (GLuint *)0x0) {
    bov_error_log(0x20001,"Cannot do a partial update whith a NULL pointer as array of elements");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_order_partial_update",0x3da);
    order_local = (bov_order_t *)0x0;
  }
  else {
    local_2c = newN;
    if (newN == 0) {
      local_2c = order->eboLen;
    }
    if (local_2c < start + count) {
      local_2c = start + count;
    }
    if (start + count < count) {
      local_2c = 0x7fffffff;
    }
    if (order->eboCapacity < local_2c) {
      bov_error_log(0x20001,
                    "Cannot do a partial update when the new size is bigger than the capacity of the buffer"
                   );
      fprintf(_stderr,"\t(in function %s, line %d)\n","bov_order_partial_update",0x3ea);
      order_local = (bov_order_t *)0x0;
    }
    else {
      order->eboLen = local_2c;
      order_local = order;
      if (count != 0) {
        (*glad_glBindBuffer)(0x8893,order->ebo);
        (*glad_glBufferSubData)(0x8893,(long)start,(long)count << 2,elements);
      }
    }
  }
  return order_local;
}

Assistant:

bov_order_t* bov_order_partial_update(bov_order_t* order, const GLuint* elements,
                              GLint start, GLsizei count, GLsizei newN)
{
	if(elements==NULL) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update whith a NULL "
		              "pointer as array of elements");
		return NULL;
	}

	if(newN==0)
		newN = order->eboLen;

	if(start + count > newN)
		newN = start+count;
	if(start + count < count) // detect overflow
		newN = BOV_TILL_END;

	if(newN > order->eboCapacity) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update when the new "
		              "size is bigger than the capacity of the "
		              "buffer");
		return NULL;
	}

	// if it is restored to a previous capacity, fill buffer with zeros
	// if(newN > order->eboLen) {
	//     glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	//     GLint offset = (GLint) order->eboLen;
	//     GLsizei len = newN - order->eboLen;
	//     GLuint* zeros = calloc(len, sizeof(GLuint));
	//     CHECK_MALLOC(zeros);
	//     glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, offset, sizeof(GLuint) * len, zeros);
	//     free(zeros);
	// }

	order->eboLen = newN;

	if(count==0)
		return order;

	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	glBufferSubData(GL_ELEMENT_ARRAY_BUFFER,
	                start,
	                sizeof(GLuint) * count,
	                elements);
	return order;
}